

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap_stl.hpp
# Opt level: O3

void chaiscript::bootstrap::standard_library::random_access_container_type<std::__cxx11::string>
               (string *param_1,Module *m)

{
  undefined1 local_71;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_70;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::standard_library::random_access_container_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string&,int)_1_,false,false,false,true,char&,std::__cxx11::string&,int>
            (&local_60,&local_71);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"[]","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_60,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_60.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  dispatch::detail::
  make_callable_impl<chaiscript::bootstrap::standard_library::random_access_container_type<std::__cxx11::string>(std::__cxx11::string_const&,chaiscript::Module&)::_lambda(std::__cxx11::string_const&,int)_1_,false,false,false,true,char_const&,std::__cxx11::string_const&,int>
            (&local_70,&local_71);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[]","");
  std::
  vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
  ::emplace_back<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>
            ((vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>
              *)&m->m_funcs,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void random_access_container_type(const std::string & /*type*/, Module &m) {
    // In the interest of runtime safety for the m, we prefer the at() method for [] access,
    // to throw an exception in an out of bounds condition.
    m.add(fun([](ContainerType &c, int index) -> typename ContainerType::reference {
            /// \todo we are preferring to keep the key as 'int' to avoid runtime conversions
            /// during dispatch. reevaluate
            return c.at(static_cast<typename ContainerType::size_type>(index));
          }),
          "[]");

    m.add(fun([](const ContainerType &c, int index) -> typename ContainerType::const_reference {
            /// \todo we are preferring to keep the key as 'int' to avoid runtime conversions
            /// during dispatch. reevaluate
            return c.at(static_cast<typename ContainerType::size_type>(index));
          }),
          "[]");
  }